

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_file_utils.cpp
# Opt level: O2

bool crnlib::file_utils::write_buf_to_file(char *pPath,void *pData,size_t data_size)

{
  FILE *__s;
  size_t sVar1;
  bool bVar2;
  
  __s = fopen(pPath,"wb");
  if (__s == (FILE *)0x0) {
    bVar2 = false;
  }
  else {
    sVar1 = fwrite(pData,1,data_size,__s);
    bVar2 = sVar1 == data_size;
    fclose(__s);
  }
  return bVar2;
}

Assistant:

bool file_utils::write_buf_to_file(const char* pPath, const void* pData, size_t data_size)
    {
        FILE* pFile = nullptr;

#if defined(CRN_CC_MSVC)
        // Compiling with MSVC
        if (fopen_s(&pFile, pPath, "wb"))
        {
            return false;
        }
#else
        pFile = fopen(pPath, "wb");
#endif
        if (!pFile)
        {
            return false;
        }

        bool success = fwrite(pData, 1, data_size, pFile) == data_size;

        fclose(pFile);

        return success;
    }